

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocationPolicyManager.h
# Opt level: O0

void __thiscall
AllocationPolicyManager::ReportFailure(AllocationPolicyManager *this,size_t byteCount)

{
  AutoCriticalSection local_20;
  AutoCriticalSection auto_cs;
  size_t byteCount_local;
  AllocationPolicyManager *this_local;
  
  auto_cs.cs = (CriticalSection *)byteCount;
  if ((this->supportConcurrency & 1U) == 0) {
    ReportFreeImpl(this,MemoryFailure,byteCount);
  }
  else {
    AutoCriticalSection::AutoCriticalSection(&local_20,&this->cs);
    ReportFreeImpl(this,MemoryFailure,(size_t)auto_cs.cs);
    AutoCriticalSection::~AutoCriticalSection(&local_20);
  }
  return;
}

Assistant:

void ReportFailure(size_t byteCount)
    {
        if (supportConcurrency)
        {
            AutoCriticalSection auto_cs(&cs);
            ReportFreeImpl(MemoryAllocateEvent::MemoryFailure, byteCount);
        }
        else
        {
            ReportFreeImpl(MemoryAllocateEvent::MemoryFailure, byteCount);
        }

    }